

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::SpecialFloatTests::init(SpecialFloatTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *pTVar3;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Run vertex shader with special float values");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Run fragment shader with special float values");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"framebuffer",
             "Test framebuffers containing special float values");
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"attribute_buffer",
             "special attribute values in a buffer");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__VertexAttributeCase_00d40cc8;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"attribute_client",
             "special attribute values in a client storage");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000000;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__VertexAttributeCase_00d40cc8;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"uniform","special uniform values");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__UniformCase_00d40d88;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"texture",
             "texture with special floating point values");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"texture_pbo",
             "texture (via pbo) with special floating point values");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 1;
  *(undefined4 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"texture_shadow",
             "shadow texture with special floating point values");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x100000000;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"sampler_tex_coord","special texture coords");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"sampler_tex_coord_cube",
             "special texture coords to cubemap");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x300000000;
  *(undefined4 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar1->m_testCtx,"sampler_lod","special texture lod");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x100000000;
  *(undefined4 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,"sampler_grad","special texture grad");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_dataplus._M_p + 4) = 0x200000000;
  *(undefined4 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"attribute_buffer",
             "special attribute values in a buffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__VertexAttributeCase_00d40cc8;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x100000000;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"attribute_client",
             "special attribute values in a client storage");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__VertexAttributeCase_00d40cc8;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"uniform","special uniform values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000000;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__UniformCase_00d40d88;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"texture",
             "texture with special floating point values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x100000000;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"texture_pbo",
             "texture (via pbo) with special floating point values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 1;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"texture_shadow",
             "shadow texture with special floating point values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureCase_00d40de8;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sampler_tex_coord","special texture coords");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 1;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sampler_tex_coord_cube",
             "special texture coords to cubemap");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x300000001;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"sampler_lod","special texture lod");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x100000001;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sampler_grad","special texture grad");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TextureSamplerCase_00d40e48;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0x200000001;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  tcu::TestNode::addChild(this_00,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_default",
             "write special floating point values to default framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_rgba4",
             "write special floating point values to RGBA4 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 1;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_rgb5_a1",
             "write special floating point values to RGB5_A1 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 2;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_rgb565",
             "write special floating point values to RGB565 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 3;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_rgba8",
             "write special floating point values to RGBA8 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 4;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_rgb10_a2",
             "write special floating point values to RGB10_A2 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 5;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_float16",
             "write special floating point values to float16 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 6;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"write_float32",
             "write special floating point values to float32 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 7;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__OutputCase_00d40ea8;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"blend_default",
             "blend special floating point values in a default framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BlendingCase_00d40f78;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"blend_rgba8",
             "blend special floating point values in a RGBA8 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 4;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BlendingCase_00d40f78;
  tcu::TestNode::addChild(this_01,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"blend_float16",
             "blend special floating point values in a float16 framebuffer");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 6;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BlendingCase_00d40f78;
  tcu::TestNode::addChild(this_01,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,this_01);
  return extraout_EAX;
}

Assistant:

void SpecialFloatTests::init (void)
{
	tcu::TestCaseGroup* const vertexGroup		= new tcu::TestCaseGroup(m_testCtx, "vertex",		"Run vertex shader with special float values");
	tcu::TestCaseGroup* const fragmentGroup		= new tcu::TestCaseGroup(m_testCtx, "fragment",		"Run fragment shader with special float values");
	tcu::TestCaseGroup* const framebufferGroup	= new tcu::TestCaseGroup(m_testCtx, "framebuffer",	"Test framebuffers containing special float values");

	// .vertex
	{
		vertexGroup->addChild(new VertexAttributeCase	(m_context, "attribute_buffer",			"special attribute values in a buffer",					VertexAttributeCase::STORAGE_BUFFER, VertexAttributeCase::TYPE_VERTEX));
		vertexGroup->addChild(new VertexAttributeCase	(m_context, "attribute_client",			"special attribute values in a client storage",			VertexAttributeCase::STORAGE_CLIENT, VertexAttributeCase::TYPE_VERTEX));
		vertexGroup->addChild(new UniformCase			(m_context, "uniform",					"special uniform values",								UniformCase::TYPE_VERTEX));
		vertexGroup->addChild(new TextureCase			(m_context, "texture",					"texture with special floating point values",			TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_CLIENT));
		vertexGroup->addChild(new TextureCase			(m_context, "texture_pbo",				"texture (via pbo) with special floating point values",	TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_PBO));
		vertexGroup->addChild(new TextureCase			(m_context, "texture_shadow",			"shadow texture with special floating point values",	TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_DEPTH, TextureCase::UPLOAD_CLIENT));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord",		"special texture coords",								TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_TEX_COORD));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord_cube",	"special texture coords to cubemap",					TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_TEX_COORD_CUBE));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_lod",				"special texture lod",									TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_LOD));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_grad",				"special texture grad",									TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_GRAD));

		addChild(vertexGroup);
	}

	// .fragment
	{
		fragmentGroup->addChild(new VertexAttributeCase	(m_context, "attribute_buffer",			"special attribute values in a buffer",					VertexAttributeCase::STORAGE_BUFFER, VertexAttributeCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new VertexAttributeCase	(m_context, "attribute_client",			"special attribute values in a client storage",			VertexAttributeCase::STORAGE_CLIENT, VertexAttributeCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new UniformCase			(m_context, "uniform",					"special uniform values",								UniformCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture",					"texture with special floating point values",			TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_CLIENT));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture_pbo",				"texture (via pbo) with special floating point values",	TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_PBO));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture_shadow",			"shadow texture with special floating point values",	TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_DEPTH, TextureCase::UPLOAD_CLIENT));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord",		"special texture coords",								TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_TEX_COORD));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord_cube",	"special texture coords to cubemap",					TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_TEX_COORD_CUBE));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_lod",				"special texture lod",									TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_LOD));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_grad",				"special texture grad",									TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_GRAD));

		addChild(fragmentGroup);
	}

	// .framebuffer
	{
		framebufferGroup->addChild(new OutputCase		(m_context, "write_default",			"write special floating point values to default framebuffer",	FramebufferRenderCase::FBO_DEFAULT));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgba4",				"write special floating point values to RGBA4 framebuffer",		FramebufferRenderCase::FBO_RGBA4));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb5_a1",			"write special floating point values to RGB5_A1 framebuffer",	FramebufferRenderCase::FBO_RGB5_A1));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb565",				"write special floating point values to RGB565 framebuffer",	FramebufferRenderCase::FBO_RGB565));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgba8",				"write special floating point values to RGBA8 framebuffer",		FramebufferRenderCase::FBO_RGBA8));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb10_a2",			"write special floating point values to RGB10_A2 framebuffer",	FramebufferRenderCase::FBO_RGB10_A2));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_float16",			"write special floating point values to float16 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT16));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_float32",			"write special floating point values to float32 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT32));

		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_default",			"blend special floating point values in a default framebuffer",	FramebufferRenderCase::FBO_DEFAULT));
		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_rgba8",				"blend special floating point values in a RGBA8 framebuffer",	FramebufferRenderCase::FBO_RGBA8));
		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_float16",			"blend special floating point values in a float16 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT16));

		addChild(framebufferGroup);
	}
}